

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O2

int check_flow_timeout(pcp_flow_t *f,void *timeout)

{
  timeval *x;
  int iVar1;
  timeval ctv;
  
  if (((f->timeout).tv_sec != 0) || ((f->timeout).tv_usec != 0)) {
    x = &f->timeout;
    gettimeofday((timeval *)&ctv,(__timezone_ptr_t)0x0);
    iVar1 = timeval_comp(x,&ctv);
    if (iVar1 < 1) {
      if (f->state == pfs_wait_resp) {
        pcp_logger(PCP_LOGLVL_WARN,"Recv of PCP response for flow %d timed out.",
                   (ulong)f->key_bucket);
      }
      handle_flow_event(f,fev_flow_timedout,(pcp_recv_msg_t *)0x0);
    }
    if ((x->tv_sec != 0) || ((f->timeout).tv_usec != 0)) {
      timeval_subtract(&ctv,x,&ctv);
      if (((*timeout != 0) || (*(long *)((long)timeout + 8) != 0)) &&
         (iVar1 = timeval_comp(&ctv,(timeval *)timeout), -1 < iVar1)) {
        return 0;
      }
      *(__time_t *)timeout = ctv.tv_sec;
      *(__suseconds_t *)((long)timeout + 8) = ctv.tv_usec;
    }
  }
  return 0;
}

Assistant:

static int check_flow_timeout(pcp_flow_t *f, void *timeout) {
    struct timeval *tout = timeout;
    struct timeval ctv;

    if ((f->timeout.tv_sec == 0) && (f->timeout.tv_usec == 0)) {
        return 0;
    }

    gettimeofday(&ctv, NULL);
    if (timeval_comp(&f->timeout, &ctv) <= 0) {
        // timed out
        if (f->state == pfs_wait_resp) {
            PCP_LOG(PCP_LOGLVL_WARN,
                    "Recv of PCP response for flow %d timed out.",
                    f->key_bucket);
        }
        handle_flow_event(f, fev_flow_timedout, NULL);
    }

    if ((f->timeout.tv_sec == 0) && (f->timeout.tv_usec == 0)) {
        return 0;
    }

    timeval_subtract(&ctv, &f->timeout, &ctv);

    if ((tout->tv_sec == 0) && (tout->tv_usec == 0)) {
        *tout = ctv;
        return 0;
    }

    if (timeval_comp(&ctv, tout) < 0) {
        *tout = ctv;
    }

    return 0;
}